

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O0

void RecordTextureColors(FTexture *pic,BYTE *usedcolors)

{
  long lVar1;
  uint local_3c;
  byte *pbStack_38;
  int count;
  BYTE *source;
  BYTE *column;
  Span *spans;
  BYTE *pBStack_18;
  int x;
  BYTE *usedcolors_local;
  FTexture *pic_local;
  
  pBStack_18 = usedcolors;
  usedcolors_local = (BYTE *)pic;
  spans._4_4_ = FTexture::GetWidth(pic);
  while (spans._4_4_ = spans._4_4_ + -1, -1 < spans._4_4_) {
    lVar1 = (**(code **)(*(long *)usedcolors_local + 0x10))(usedcolors_local,spans._4_4_,&column);
    for (; *(short *)(column + 2) != 0; column = column + 4) {
      local_3c = (uint)*(ushort *)(column + 2);
      pbStack_38 = (byte *)(lVar1 + (int)(uint)*(ushort *)column);
      do {
        pBStack_18[*pbStack_38] = '\x01';
        local_3c = local_3c - 1;
        pbStack_38 = pbStack_38 + 1;
      } while (local_3c != 0);
    }
  }
  return;
}

Assistant:

void RecordTextureColors (FTexture *pic, BYTE *usedcolors)
{
	int x;

	for (x = pic->GetWidth() - 1; x >= 0; x--)
	{
		const FTexture::Span *spans;
		const BYTE *column = pic->GetColumn (x, &spans);

		while (spans->Length != 0)
		{
			const BYTE *source = column + spans->TopOffset;
			int count = spans->Length;

			do
			{
				usedcolors[*source++] = 1;
			} while (--count);

			spans++;
		}
	}
}